

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O0

UpnpDiscovery * UpnpDiscovery_new(void)

{
  UpnpString *pUVar1;
  s_UpnpDiscovery *p;
  
  p = (s_UpnpDiscovery *)calloc(1,200);
  if (p == (s_UpnpDiscovery *)0x0) {
    p = (s_UpnpDiscovery *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_DeviceID = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_DeviceType = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_ServiceType = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_ServiceVer = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_Location = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_Os = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_Date = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_Ext = pUVar1;
  }
  return p;
}

Assistant:

UpnpDiscovery *UpnpDiscovery_new(void)
{
	struct s_UpnpDiscovery *p = calloc(1, sizeof(struct s_UpnpDiscovery));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	/*p->m_Expires = 0;*/
	p->m_DeviceID = UpnpString_new();
	p->m_DeviceType = UpnpString_new();
	p->m_ServiceType = UpnpString_new();
	p->m_ServiceVer = UpnpString_new();
	p->m_Location = UpnpString_new();
	p->m_Os = UpnpString_new();
	p->m_Date = UpnpString_new();
	p->m_Ext = UpnpString_new();
	/* memset(&p->m_DestAddr, 0, sizeof (struct sockaddr_storage)); */

	return (UpnpDiscovery *)p;
}